

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
lockEntriesAndGrowIfNeeded
          (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
           *this,size_t *newMemUsed)

{
  Entry *pEVar1;
  
  pEVar1 = lockEntries(this);
  if (this->_size * 2 < this->_numEntries) {
    return pEVar1;
  }
  pEVar1 = grow(this,pEVar1,newMemUsed);
  return pEVar1;
}

Assistant:

Entry* lockEntriesAndGrowIfNeeded(size_t& newMemUsed)
    {
        Entry* entries = lockEntries();
        if (_size*2 >= _numEntries) {
            entries = grow(entries, newMemUsed);
        }
        return entries;
    }